

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O0

void __thiscall
Js::SourceDynamicProfileManager::EnsureStartupFunctions
          (SourceDynamicProfileManager *this,uint numberOfFunctions)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  BVFixed **ppBVar5;
  BVFixed *pBVar6;
  Recycler *alloc;
  BVFixed *pBVar7;
  BVFixed *oldStartupFunctions;
  uint numberOfFunctions_local;
  SourceDynamicProfileManager *this_local;
  
  if (numberOfFunctions == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                ,0x45,"(numberOfFunctions != 0)","numberOfFunctions != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppBVar5 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                      ((WriteBarrierPtr *)&this->startupFunctions);
  if (*ppBVar5 != (BVFixed *)0x0) {
    pBVar6 = Memory::WriteBarrierPtr<BVFixed>::operator->(&this->startupFunctions);
    BVar3 = BVFixed::Length(pBVar6);
    if (numberOfFunctions <= BVar3) {
      return;
    }
  }
  ppBVar5 = Memory::WriteBarrierPtr::operator_cast_to_BVFixed__
                      ((WriteBarrierPtr *)&this->startupFunctions);
  pBVar6 = *ppBVar5;
  alloc = GetRecycler(this);
  pBVar7 = BVFixed::New<Memory::Recycler>(numberOfFunctions,alloc,false);
  Memory::WriteBarrierPtr<BVFixed>::operator=(&this->startupFunctions,pBVar7);
  if (pBVar6 != (BVFixed *)0x0) {
    pBVar7 = Memory::WriteBarrierPtr<BVFixed>::operator->(&this->startupFunctions);
    BVFixed::Copy(pBVar7,pBVar6);
  }
  return;
}

Assistant:

void SourceDynamicProfileManager::EnsureStartupFunctions(uint numberOfFunctions)
    {
        Assert(numberOfFunctions != 0);
        if(!startupFunctions || numberOfFunctions > startupFunctions->Length())
        {
            BVFixed* oldStartupFunctions = this->startupFunctions;
            startupFunctions = BVFixed::New(numberOfFunctions, this->GetRecycler());
            if(oldStartupFunctions)
            {
                this->startupFunctions->Copy(oldStartupFunctions);
            }
        }
    }